

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dos-op.c
# Opt level: O1

int dos_get_volume_label(hd_context *ctx,dos_disk *disk)

{
  byte bVar1;
  uchar *puVar2;
  long lVar3;
  byte bVar4;
  bool bVar5;
  
  puVar2 = disk->first_sector;
  lVar3 = 0;
  bVar4 = 0;
  do {
    bVar1 = puVar2[lVar3 + 0x1c2];
    if (bVar1 < 0xf) {
      if ((bVar1 != 0) && (bVar1 != 5)) {
LAB_00102086:
        if (*(short *)(puVar2 + 0x1fe) == -0x55ab) {
          if (bVar1 != 0) goto LAB_00102096;
          goto LAB_001020ba;
        }
      }
    }
    else if (bVar1 != 0xf) {
      if (bVar1 != 0x42) goto LAB_00102086;
LAB_00102096:
      if ((puVar2[lVar3 + 0x1be] & 0x7f) == 0) {
        bVar5 = *(int *)(puVar2 + lVar3 + 0x1ca) - 0x40U < 0xfffffec0;
      }
      else {
LAB_001020ba:
        bVar5 = false;
      }
      if (bVar5 != false) {
        (disk->super).volume[bVar4].beginsector = (ulong)*(uint *)(puVar2 + lVar3 + 0x1c6);
        (disk->super).volume[bVar4].partition_info_sector = 0;
        (disk->super).volume[bVar4].total_sectors = (ulong)*(uint *)(puVar2 + lVar3 + 0x1ca);
      }
      bVar4 = bVar4 + bVar5;
    }
    lVar3 = lVar3 + 0x10;
    if (lVar3 == 0x40) {
      return (int)bVar4;
    }
  } while( true );
}

Assistant:

int dos_get_volume_label(hd_context *ctx, dos_disk *disk)
{
    com_mbr *mbr = (com_mbr *)disk->first_sector;

    uint8_t ret,curpart;
    curpart = 0;

    int i;
    for (i = 0; i < 4; i++)
    {
        ret = 0;
        if ( mbr->partition[i].pid == 0x05 || mbr->partition[i].pid == 0x0f )
        {
            ret = parse_extend_partition(ctx, disk, &(mbr->partition[i]), curpart, 0);
            if (ret)
                curpart = ret;
        } else if (mbr->partition[i].pid == 0x42)
        {
            ret = parse_extend_partition(ctx, disk, &(mbr->partition[i]), curpart, 0);
            if (ret)
                curpart = ret;
            else
            {
                if (parse_master_partition(ctx, disk, &(mbr->partition[i]), curpart, 0))
                    curpart++;
            }
        } else if (mbr->partition[i].pid != 0 && mbr->byEnding == 0xAA55)
        {
            if (parse_master_partition(ctx, disk, &(mbr->partition[i]), curpart, 0))
                curpart++;
        }
    }

    return curpart;
}